

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseReactionTaskFunction::ExtractSnapObjectDataInto
          (JavascriptPromiseReactionTaskFunction *this,SnapObject *objData,SlabAllocator *alloc)

{
  bool bVar1;
  int iVar2;
  uint dependsOnArrayCount;
  void **ppvVar3;
  JavascriptPromiseReaction *this_00;
  unsigned_long *dependsOnArray;
  Type *pTVar4;
  uint local_84;
  uint32 i;
  TTD_PTR_ID *depOnArray;
  void *pvStack_70;
  uint32 depOnCount;
  undefined1 local_58 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  SnapPromiseReactionTaskFunctionInfo *sprtfi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptPromiseReactionTaskFunction *this_local;
  
  depOnList._40_8_ =
       TTD::SlabAllocatorBase<0>::
       SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo>(alloc);
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       local_58,&Memory::HeapAllocator::Instance,4);
  ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument);
  *(void **)depOnList._40_8_ = *ppvVar3;
  ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument);
  if (*ppvVar3 != (void *)0x0) {
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument);
    bVar1 = TTD::JsSupport::IsVarComplexKind(*ppvVar3);
    if (bVar1) {
      ppvVar3 = Memory::PointerValue<void>(&this->argument);
      pvStack_70 = *ppvVar3;
      JsUtil::
      List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                ((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)local_58,(unsigned_long *)&stack0xffffffffffffff90);
    }
  }
  this_00 = Memory::WriteBarrierPtr<Js::JavascriptPromiseReaction>::operator->(&this->reaction);
  JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
            (this_00,(SnapPromiseReactionInfo *)(depOnList._40_8_ + 8),
             (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)local_58,alloc);
  iVar2 = JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *)local_58
                    );
  if (iVar2 == 0) {
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)30>
              (objData,(SnapPromiseReactionTaskFunctionInfo *)depOnList._40_8_);
  }
  else {
    dependsOnArrayCount =
         JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Count
                   ((ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *)local_58)
    ;
    dependsOnArray =
         TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>
                   (alloc,(ulong)dependsOnArrayCount);
    for (local_84 = 0; local_84 < dependsOnArrayCount; local_84 = local_84 + 1) {
      pTVar4 = JsUtil::
               List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_58,local_84);
      dependsOnArray[local_84] = *pTVar4;
    }
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)30>
              (objData,(SnapPromiseReactionTaskFunctionInfo *)depOnList._40_8_,alloc,
               dependsOnArrayCount,dependsOnArray);
  }
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        local_58);
  return;
}

Assistant:

void JavascriptPromiseReactionTaskFunction::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo* sprtfi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo>();

        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);

        sprtfi->Argument = this->argument;

        if(this->argument != nullptr && TTD::JsSupport::IsVarComplexKind(this->argument))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->argument));
        }

        this->reaction->ExtractSnapPromiseReactionInto(&sprtfi->Reaction, depOnList, alloc);

        //see what we need to do wrt dependencies
        if(depOnList.Count() == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject>(objData, sprtfi);
        }
        else
        {
            uint32 depOnCount = depOnList.Count();
            TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

            for(uint32 i = 0; i < depOnCount; ++i)
            {
                depOnArray[i] = depOnList.Item(i);
            }

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject>(objData, sprtfi, alloc, depOnCount, depOnArray);
        }
    }